

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_SGN(Context *ctx)

{
  int iVar1;
  int iVar2;
  size_t in_RCX;
  size_t in_RDX;
  char scratch1 [64];
  char src0 [64];
  char dst [64];
  char scratch2 [64];
  char acStack_128 [64];
  char local_e8 [64];
  char local_a8 [64];
  char local_68 [72];
  
  if (ctx->profile_supports_nv2 != 0) {
    emit_ARB1_opcode_ds(ctx,"SSG");
    return;
  }
  make_ARB1_destarg_string(ctx,local_a8,in_RDX);
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args,local_e8,in_RCX);
  iVar1 = ctx->scratch_registers;
  iVar2 = iVar1 + 1;
  ctx->scratch_registers = iVar2;
  if (ctx->max_scratch_registers <= iVar1) {
    ctx->max_scratch_registers = iVar2;
  }
  snprintf(acStack_128,0x40,"scratch%d");
  iVar1 = ctx->scratch_registers;
  iVar2 = iVar1 + 1;
  ctx->scratch_registers = iVar2;
  if (ctx->max_scratch_registers <= iVar1) {
    ctx->max_scratch_registers = iVar2;
  }
  snprintf(local_68,0x40,"scratch%d");
  output_line(ctx,"SLT %s, %s, 0.0;",acStack_128,local_e8);
  output_line(ctx,"SLT %s, -%s, 0.0;",local_68,local_e8);
  output_line(ctx,"ADD%s -%s, %s;",local_a8,acStack_128,local_68);
  emit_ARB1_dest_modifiers(ctx);
  return;
}

Assistant:

static void emit_ARB1_SGN(Context *ctx)
{
    if (support_nv2(ctx))
        emit_ARB1_opcode_ds(ctx, "SSG");
    else
    {
        char dst[64];
        char src0[64];
        char scratch1[64];
        char scratch2[64];
        make_ARB1_destarg_string(ctx, dst, sizeof (dst));
        make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));
        allocate_ARB1_scratch_reg_name(ctx, scratch1, sizeof (scratch1));
        allocate_ARB1_scratch_reg_name(ctx, scratch2, sizeof (scratch2));
        output_line(ctx, "SLT %s, %s, 0.0;", scratch1, src0);
        output_line(ctx, "SLT %s, -%s, 0.0;", scratch2, src0);
        output_line(ctx, "ADD%s -%s, %s;", dst, scratch1, scratch2);
        emit_ARB1_dest_modifiers(ctx);
    } // else
}